

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O3

void __thiscall Glucose::MultiSolvers::adjustNumberOfCores(MultiSolvers *this)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  
  dVar3 = memUsed();
  if (this->nbthreads == 0) {
    if (this->verb < 1) {
      bVar1 = false;
    }
    else {
      printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n"
             ,(ulong)this->maxmemory,(ulong)this->maxnbsolvers);
      bVar1 = 0 < this->verb;
    }
    uVar2 = (uint)(long)((float)((this->maxmemory << 2) / 10) / (float)dVar3);
    if (this->maxnbsolvers < uVar2) {
      uVar2 = this->maxnbsolvers;
    }
    uVar2 = uVar2 + (uVar2 == 0);
    if (bVar1) {
      printf("c |  One Solver is taking %.2fMb... Let\'s take %d solvers for this run (max 40%% of the maxmemory).       |\n"
             ,(double)(float)dVar3,(ulong)uVar2);
    }
    this->nbsolvers = uVar2;
    this->nbthreads = uVar2;
  }
  return;
}

Assistant:

void MultiSolvers::adjustNumberOfCores() {
    float mem = memUsed();
    if(nbthreads == 0) { // Automatic configuration
        if(verb >= 1)
            printf("c |  Automatic Adjustement of the number of solvers. MaxMemory=%5d, MaxCores=%3d.                       |\n", maxmemory, maxnbsolvers);
        unsigned int tmpnbsolvers = maxmemory * 4 / 10 / mem;
        if(tmpnbsolvers > maxnbsolvers) tmpnbsolvers = maxnbsolvers;
        if(tmpnbsolvers < 1) tmpnbsolvers = 1;
        if(verb >= 1)
            printf("c |  One Solver is taking %.2fMb... Let's take %d solvers for this run (max 40%% of the maxmemory).       |\n", mem, tmpnbsolvers);
        nbsolvers = tmpnbsolvers;
        nbthreads = nbsolvers;
    } else {
        assert(nbthreads == nbsolvers);
    }
}